

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_concave_shell(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  ulong uVar1;
  bool bVar2;
  void *arg1;
  long in_RDX;
  __type_conflict2 _Var3;
  char_data **in_stack_00000068;
  _func_void_char_data_ptr_int_ptr_room_index_data_ptr *in_stack_00000070;
  string *in_stack_00000078;
  string *in_stack_00000080;
  int in_stack_0000008c;
  CQueue *in_stack_00000090;
  int *dirptr;
  room_index_data **in_stack_000000a8;
  int dir;
  EXIT_DATA *pexit;
  int **arg2;
  undefined8 in_stack_ffffffffffffff30;
  int sn_00;
  CHAR_DATA *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *format;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_59;
  string local_58 [32];
  int *local_38;
  int local_2c;
  long *local_28;
  long local_10;
  
  sn_00 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_38 = (int *)0x0;
  local_10 = in_RDX;
  bVar2 = str_cmp(target_name,"n");
  if ((bVar2) && (bVar2 = str_cmp(target_name,"north"), bVar2)) {
    bVar2 = str_cmp(target_name,"e");
    if ((bVar2) && (bVar2 = str_cmp(target_name,"east"), bVar2)) {
      bVar2 = str_cmp(target_name,"s");
      if ((bVar2) && (bVar2 = str_cmp(target_name,"south"), bVar2)) {
        bVar2 = str_cmp(target_name,"w");
        if ((bVar2) && (bVar2 = str_cmp(target_name,"west"), bVar2)) {
          bVar2 = str_cmp(target_name,"u");
          if ((bVar2) && (bVar2 = str_cmp(target_name,"up"), bVar2)) {
            bVar2 = str_cmp(target_name,"d");
            if ((bVar2) && (bVar2 = str_cmp(target_name,"down"), bVar2)) {
              send_to_char(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
              return;
            }
            local_2c = 5;
          }
          else {
            local_2c = 4;
          }
        }
        else {
          local_2c = 3;
        }
      }
      else {
        local_2c = 2;
      }
    }
    else {
      local_2c = 1;
    }
  }
  else {
    local_2c = 0;
  }
  local_28 = *(long **)(*(long *)(local_10 + 0xa8) + 0x38 + (long)local_2c * 8);
  if ((local_28 != (long *)0x0) && (*local_28 != 0)) {
    __a = (allocator<char> *)local_28[1];
    _Var3 = std::pow<int,int>(0,0x6e3cdf);
    if (((((ulong)__a & (long)_Var3) == 0) ||
        (bVar2 = is_affected_by(in_stack_ffffffffffffff38,sn_00), bVar2)) &&
       ((uVar1 = local_28[1], _Var3 = std::pow<int,int>(0,0x6e3d2a), (uVar1 & (long)_Var3) == 0 ||
        (uVar1 = local_28[1], _Var3 = std::pow<int,int>(0,0x6e3d5d), (uVar1 & (long)_Var3) == 0))))
    {
      *(undefined1 *)(local_10 + 0x32c) = 0;
      local_38 = (int *)talloc_struct((long)in_stack_ffffffffffffff38);
      *local_38 = local_2c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__a);
      format = &stack0xffffffffffffff6f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__a);
      arg1 = (void *)(local_10 + 0xa8);
      arg2 = &local_38;
      CQueue::
      AddToQueue<void(*)(char_data*,int*,room_index_data*),char_data*&,int*&,room_index_data*&>
                (in_stack_00000090,in_stack_0000008c,in_stack_00000080,in_stack_00000078,
                 in_stack_00000070,in_stack_00000068,(int **)dirptr,in_stack_000000a8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator(&local_59);
      act(format,in_stack_ffffffffffffff38,arg1,arg2,0);
      act(format,in_stack_ffffffffffffff38,arg1,arg2,0);
      return;
    }
  }
  send_to_char(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  return;
}

Assistant:

void spell_concave_shell(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	EXIT_DATA *pexit;
	int dir;
	int *dirptr = nullptr;

	if (!str_cmp(target_name, "n") || !str_cmp(target_name, "north"))
	{
		dir = Directions::North;
	}
	else if (!str_cmp(target_name, "e") || !str_cmp(target_name, "east"))
	{
		dir = Directions::East;
	}
	else if (!str_cmp(target_name, "s") || !str_cmp(target_name, "south"))
	{
		dir = Directions::South;
	}
	else if (!str_cmp(target_name, "w") || !str_cmp(target_name, "west"))
	{
		dir = Directions::West;
	}
	else if (!str_cmp(target_name, "u") || !str_cmp(target_name, "up"))
	{
		dir = Directions::Up;
	}
	else if (!str_cmp(target_name, "d") || !str_cmp(target_name, "down"))
	{
		dir = Directions::Down;
	}
	else
	{
		send_to_char("In which direction?\n\r", ch);
		return;
	}

	pexit = ch->in_room->exit[dir];

	if (pexit == nullptr
		|| pexit->u1.to_room == nullptr
		|| (IS_SET(pexit->exit_info, EX_CLOSED) && !is_affected_by(ch, AFF_PASS_DOOR))
		|| (IS_SET(pexit->exit_info, EX_CLOSED) && IS_SET(pexit->exit_info, EX_NOPASS)))
	{
		send_to_char("That direction is obstructed!\n\r", ch);
		return;
	}

	ch->disrupted = false;

	dirptr = (int *)talloc_struct(sizeof(int));
	*dirptr = dir;

	RS.Queue.AddToQueue(6, "spell_concave_shell", "concave_shell_move", concave_shell_move, ch, dirptr, ch->in_room);

	act("Air begins to swirl rapidly around you.", ch, 0, 0, TO_CHAR);
	act("Swirling winds begin to mass near $n.", ch, 0, 0, TO_ROOM);
}